

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_with_normal_and_texture.c
# Opt level: O3

bool_t prf_vertex_with_normal_and_texture_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint16_t uVar1;
  ushort uVar2;
  uint32_t uVar3;
  float64_t *pfVar4;
  uint len;
  bool_t bVar5;
  uint uVar6;
  node_data_conflict15 *data;
  float32_t fVar7;
  float64_t fVar8;
  
  uVar1 = bf_get_uint16_be(bfile);
  node->opcode = uVar1;
  if (uVar1 == prf_vertex_with_normal_and_texture_info.opcode) {
    uVar1 = bf_get_uint16_be(bfile);
    node->length = uVar1;
    if (uVar1 < 0x20) {
      prf_error(6,"vertex with normal and texture too short (%d bytes).");
      return 0;
    }
    pfVar4 = (float64_t *)node->data;
    if (pfVar4 == (float64_t *)0x0) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        pfVar4 = (float64_t *)malloc((ulong)(uVar1 - 4));
      }
      else {
        pfVar4 = (float64_t *)pool_malloc(pool_id,uVar1 - 4);
      }
      node->data = (uint8_t *)pfVar4;
      if (pfVar4 == (float64_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        uVar6 = 8;
        goto LAB_0010b183;
      }
    }
    uVar1 = bf_get_uint16_be(bfile);
    *(uint16_t *)(pfVar4 + 3) = uVar1;
    uVar1 = bf_get_uint16_be(bfile);
    *(uint16_t *)((long)pfVar4 + 0x1a) = uVar1;
    fVar8 = bf_get_float64_be(bfile);
    *pfVar4 = fVar8;
    fVar8 = bf_get_float64_be(bfile);
    pfVar4[1] = fVar8;
    fVar8 = bf_get_float64_be(bfile);
    pfVar4[2] = fVar8;
    uVar2 = node->length;
    uVar6 = 0x20;
    if (0x23 < uVar2) {
      fVar7 = bf_get_float32_be(bfile);
      *(float32_t *)((long)pfVar4 + 0x1c) = fVar7;
      uVar2 = node->length;
      uVar6 = 0x24;
      if (0x27 < uVar2) {
        fVar7 = bf_get_float32_be(bfile);
        *(float32_t *)(pfVar4 + 4) = fVar7;
        uVar2 = node->length;
        uVar6 = 0x28;
        if (0x2b < uVar2) {
          fVar7 = bf_get_float32_be(bfile);
          *(float32_t *)((long)pfVar4 + 0x24) = fVar7;
          uVar2 = node->length;
          uVar6 = 0x2c;
          if (0x2f < uVar2) {
            fVar7 = bf_get_float32_be(bfile);
            *(float32_t *)(pfVar4 + 5) = fVar7;
            uVar2 = node->length;
            uVar6 = 0x30;
            if (0x33 < uVar2) {
              fVar7 = bf_get_float32_be(bfile);
              *(float32_t *)((long)pfVar4 + 0x2c) = fVar7;
              uVar2 = node->length;
              uVar6 = 0x34;
              if (0x37 < uVar2) {
                uVar3 = bf_get_uint32_be(bfile);
                *(uint32_t *)(pfVar4 + 6) = uVar3;
                uVar2 = node->length;
                uVar6 = 0x38;
                if (0x3b < uVar2) {
                  uVar3 = bf_get_uint32_be(bfile);
                  *(uint32_t *)((long)pfVar4 + 0x34) = uVar3;
                  uVar2 = node->length;
                  uVar6 = 0x3c;
                }
              }
            }
          }
        }
      }
    }
    bVar5 = 1;
    len = uVar2 - uVar6;
    if (uVar6 <= uVar2 && len != 0) {
      bf_read(bfile,node->data + ((ulong)uVar6 - 4),len);
    }
  }
  else {
    prf_error(9,"tried vertex with normal and texture load method on node of type %d",(ulong)uVar1);
    uVar6 = 2;
LAB_0010b183:
    bVar5 = 0;
    bf_rewind(bfile,uVar6);
  }
  return bVar5;
}

Assistant:

static
bool_t
prf_vertex_with_normal_and_texture_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_vertex_with_normal_and_texture_info.opcode ) {
        prf_error( 9,
          "tried vertex with normal and texture load method on node of type %d",
          node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );
    if ( node->length < 32 ) {
        prf_error( 6, "vertex with normal and texture too short (%d bytes).",
            node->length );
        return FALSE;
    }

    if ( node->length > 4 && node->data == NULL ) { /* not preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 8 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        data->color_name_index = bf_get_uint16_be( bfile ); pos += 2;
        data->flags = bf_get_uint16_be( bfile ); pos += 2;
        prf_dblwrite( data->x, bf_get_float64_be( bfile ) ); pos += 8;
        prf_dblwrite( data->y, bf_get_float64_be( bfile ) ); pos += 8;
        prf_dblwrite( data->z, bf_get_float64_be( bfile ) ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        data->normal[0] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->normal[1] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->normal[2] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->texture[0] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->texture[1] = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->packed_color = bf_get_uint32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->color_index = bf_get_uint32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}